

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O0

void __thiscall
WordSplitNTest_random_view_Test<char16_t>::TestBody(WordSplitNTest_random_view_Test<char16_t> *this)

{
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  reference rhs;
  AssertHelper local_158 [8];
  Message local_150 [8];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_148;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_2;
  Message local_110 [8];
  undefined1 local_108 [8];
  AssertionResult gtest_ar_1;
  size_t index;
  Message local_e8 [8];
  unsigned_long local_e0;
  size_type local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar;
  undefined1 local_b0 [8];
  vector<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::allocator<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_>_>
  split_result;
  size_t n;
  RandomWordTestData<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  data;
  WordSplitNTest_random_view_Test<char16_t> *this_local;
  
  data.m_token_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  RandomWordTestData<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  ::RandomWordTestData
            ((RandomWordTestData<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
              *)&n,L'\0',0,0);
  split_result.
  super__Vector_base<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::allocator<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x4;
  jessilib::
  word_split_n_view<std::vector,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_char16_t>
            ((container_type_conflict18 *)local_b0,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             &data.m_fixed_word_length,L"",4);
  local_d8 = std::
             vector<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::allocator<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_>_>
             ::size((vector<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::allocator<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_>_>
                     *)local_b0);
  local_e0 = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_d0,"split_result.size()","n + 1",&local_d8,&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&index,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0xc1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&index,local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&index);
    testing::Message::~Message(local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  for (gtest_ar_1.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl =
            (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0;
      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x4; gtest_ar_1.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl =
                  (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                   )((long)gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl + 1)) {
    pvVar3 = std::
             vector<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::allocator<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_>_>
             ::operator[]((vector<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::allocator<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_>_>
                           *)local_b0,
                          (size_type)
                          gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl);
    rhs = std::
          vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                        *)((long)&data.m_str.field_2 + 8),
                       (size_type)
                       gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    testing::internal::EqHelper::
    Compare<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_nullptr>
              ((EqHelper *)local_108,"split_result[index]","data.m_tokens[index]",pvVar3,rhs);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
    if (!bVar1) {
      testing::Message::Message(local_110);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
                 ,0xc3,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(local_110);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  }
  pvVar3 = std::
           vector<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::allocator<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_>_>
           ::operator[]((vector<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::allocator<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_>_>
                         *)local_b0,4);
  RandomWordTestData<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  ::get_remainder(&local_148,
                  (RandomWordTestData<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                   *)&n,4);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_nullptr>
            ((EqHelper *)local_128,"split_result[n]","data.get_remainder(n)",pvVar3,&local_148);
  std::__cxx11::u16string::~u16string((u16string *)&local_148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              (local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0xc6,pcVar2);
    testing::internal::AssertHelper::operator=(local_158,local_150);
    testing::internal::AssertHelper::~AssertHelper(local_158);
    testing::Message::~Message(local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  std::
  vector<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::allocator<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_>_>
  ::~vector((vector<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::allocator<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_>_>
             *)local_b0);
  RandomWordTestData<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  ::~RandomWordTestData
            ((RandomWordTestData<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
              *)&n);
  return;
}

Assistant:

TYPED_TEST(WordSplitNTest, random_view) {
	RandomWordTestData<TypeParam> data{};
	constexpr size_t n = 4;
	std::vector<std::basic_string_view<TypeParam>> split_result = word_split_n_view(data.m_str, default_delim<TypeParam>, n);

	// Tokens shall be same up until last one (n + 1)
	EXPECT_EQ(split_result.size(), n + 1);
	for (size_t index = 0; index != n; ++index) {
		EXPECT_EQ(split_result[index], data.m_tokens[index]);
	}

	EXPECT_EQ(split_result[n], data.get_remainder(n));
}